

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpgradeAI.cpp
# Opt level: O0

void __thiscall tiger::trains::ai::UpgradeAI::step(UpgradeAI *this)

{
  IUpgradeble *pIVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  reference this_00;
  __normal_iterator<const_std::pair<tiger::trains::world::IUpgradeble_*,_int>_*,_std::vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>_>
  *this_01;
  __normal_iterator<const_std::pair<tiger::trains::world::IUpgradeble_*,_int>_*,_std::vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>_>
  *p_Var6;
  reference pvVar7;
  iterator __position;
  __normal_iterator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_*,_std::vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>_>
  *in_RDI;
  int level;
  IUpgradeble *target;
  int i;
  vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>
  *upgradeVector;
  int ar;
  reference __i;
  iterator in_stack_ffffffffffffffb0;
  int local_1c;
  int local_c;
  
  local_c = trains::world::Town::getArrmor((Town *)in_RDI[1]._M_current);
  bVar2 = std::
          queue<std::vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>,_std::deque<std::vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>,_std::allocator<std::vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>_>_>_>
          ::empty((queue<std::vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>,_std::deque<std::vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>,_std::allocator<std::vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>_>_>_>
                   *)0x25aede);
  if (!bVar2) {
    this_00 = std::
              queue<std::vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>,_std::deque<std::vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>,_std::allocator<std::vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>_>_>_>
              ::front((queue<std::vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>,_std::deque<std::vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>,_std::allocator<std::vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>_>_>_>
                       *)0x25aef7);
    local_1c = 0;
    while( true ) {
      this_01 = (__normal_iterator<const_std::pair<tiger::trains::world::IUpgradeble_*,_int>_*,_std::vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>_>
                 *)(long)local_1c;
      p_Var6 = (__normal_iterator<const_std::pair<tiger::trains::world::IUpgradeble_*,_int>_*,_std::vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>_>
                *)std::
                  vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>
                  ::size(this_00);
      if (p_Var6 <= this_01) break;
      pvVar7 = std::
               vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>
               ::operator[](this_00,(long)local_1c);
      pIVar1 = pvVar7->first;
      pvVar7 = std::
               vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>
               ::operator[](this_00,(long)local_1c);
      iVar4 = pvVar7->second;
      iVar3 = (*pIVar1->_vptr_IUpgradeble[2])();
      if (((iVar3 + 1 == iVar4) &&
          (iVar4 = (*pIVar1->_vptr_IUpgradeble[3])(),
          iVar4 < local_c - *(int *)&in_RDI[3]._M_current)) &&
         (uVar5 = (*pIVar1->_vptr_IUpgradeble[5])(), (uVar5 & 1) != 0)) {
        (*pIVar1->_vptr_IUpgradeble[4])();
        iVar4 = (*pIVar1->_vptr_IUpgradeble[3])();
        local_c = local_c - iVar4;
        __i = this_00;
        __position = std::
                     vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>
                     ::begin(this_00);
        __gnu_cxx::
        __normal_iterator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_*,_std::vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>_>
        ::operator+(in_RDI,(difference_type)this_01);
        __gnu_cxx::
        __normal_iterator<std::pair<tiger::trains::world::IUpgradeble*,int>const*,std::vector<std::pair<tiger::trains::world::IUpgradeble*,int>,std::allocator<std::pair<tiger::trains::world::IUpgradeble*,int>>>>
        ::__normal_iterator<std::pair<tiger::trains::world::IUpgradeble*,int>*>
                  (this_01,(__normal_iterator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_*,_std::vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>_>
                            *)__i);
        in_stack_ffffffffffffffb0 =
             std::
             vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>
             ::erase(in_stack_ffffffffffffffb0._M_current,__position._M_current);
      }
      else {
        local_1c = local_1c + 1;
      }
    }
    bVar2 = std::
            vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>
            ::empty((vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>
                     *)in_stack_ffffffffffffffb0._M_current);
    if (bVar2) {
      std::
      queue<std::vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>,_std::deque<std::vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>,_std::allocator<std::vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>_>_>_>
      ::pop((queue<std::vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>,_std::deque<std::vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>,_std::allocator<std::vector<std::pair<tiger::trains::world::IUpgradeble_*,_int>,_std::allocator<std::pair<tiger::trains::world::IUpgradeble_*,_int>_>_>_>_>_>
             *)0x25b03e);
    }
  }
  return;
}

Assistant:

void UpgradeAI::step()
{
    int ar = town->getArrmor();

    if (upgradeQueue.empty())
        return;

    std::vector<std::pair<world::IUpgradeble *, int>> &upgradeVector = upgradeQueue.front();

    int i = 0;

    while (i < upgradeVector.size())
    {
        world::IUpgradeble *target = upgradeVector[i].first;
        int level = upgradeVector[i].second;

        if (target->getLevel() + 1 == level &&
                target->getNextLevelPrice() < ar - RESERV_ARMOR &&
                target->isReadyToUpgrade())
        {
            target->upgrade();
            ar -= target->getNextLevelPrice();
            upgradeVector.erase(upgradeVector.begin() + i);
        }
        else
            i++;
    }

    if (upgradeVector.empty())
        upgradeQueue.pop();

}